

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O1

void __thiscall gl4cts::GLSL420Pack::BindingSamplersTest::releaseResource(BindingSamplersTest *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  Utils::texture::release(&this->m_goku_texture);
  Utils::texture::release(&this->m_vegeta_texture);
  Utils::texture::release(&this->m_trunks_texture);
  if ((this->m_buffer).m_id != 0) {
    iVar1 = (*((this->m_buffer).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x438))(1,&this->m_buffer);
    (this->m_buffer).m_id = 0;
  }
  return;
}

Assistant:

void BindingSamplersTest::releaseResource()
{
	m_goku_texture.release();
	m_vegeta_texture.release();
	m_trunks_texture.release();
	m_buffer.release();
}